

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_utilities.h
# Opt level: O0

type dlib::
     sum<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,2l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>
               (matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                *m)

{
  bool bVar1;
  long lVar2;
  const_ret_type cVar3;
  matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  *in_RDI;
  long r_1;
  long c_1;
  long c;
  long r;
  type val;
  long in_stack_ffffffffffffffa8;
  matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  *in_stack_ffffffffffffffb0;
  matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  *this;
  matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  *local_30;
  long local_28;
  long local_20;
  long local_18;
  type local_10;
  
  local_10 = 0;
  bVar1 = is_row_major<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,2l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>
                    (in_RDI);
  if (bVar1) {
    for (local_18 = 0;
        lVar2 = matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                ::nr((matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                      *)0x497102), local_18 < lVar2; local_18 = local_18 + 1) {
      for (local_20 = 0;
          lVar2 = matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                  ::nc((matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                        *)0x49712c), local_20 < lVar2; local_20 = local_20 + 1) {
        cVar3 = matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                ::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x49714d);
        local_10 = cVar3 + local_10;
      }
    }
  }
  else {
    for (local_28 = 0;
        lVar2 = matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                ::nc((matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                      *)0x49719e), local_28 < lVar2; local_28 = local_28 + 1) {
      local_30 = (matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                  *)0x0;
      while (this = local_30,
            lVar2 = matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                    ::nr((matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                          *)0x4971c8), (long)this < lVar2) {
        cVar3 = matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                ::operator()(this,in_stack_ffffffffffffffa8,0x4971e9);
        local_10 = cVar3 + local_10;
        local_30 = local_30 + 1;
      }
    }
  }
  return local_10;
}

Assistant:

const typename lazy_disable_if<is_matrix<typename EXP::type>, EXP>::type sum (
        const matrix_exp<EXP>& m
    )
    {
        typedef typename matrix_exp<EXP>::type type;

        type val = 0;
        if (is_row_major(m))
        {
            for (long r = 0; r < m.nr(); ++r)
            {
                for (long c = 0; c < m.nc(); ++c)
                {
                    val += m(r,c);
                }
            }
        }
        else
        {
            for (long c = 0; c < m.nc(); ++c)
            {
                for (long r = 0; r < m.nr(); ++r)
                {
                    val += m(r,c);
                }
            }
        }
        return val;
    }